

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spikeestimator.cxx
# Opt level: O2

Matrix * __thiscall
SpikeEstimator::getEstimate(Matrix *__return_storage_ptr__,SpikeEstimator *this,Property *what)

{
  uint uVar1;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  Matrix local_118;
  
  if (*what == 4) {
    Matrix::Matrix(__return_storage_ptr__,1);
    std::__cxx11::string::string
              ((string *)&local_178,
               (string *)
               &(this->spkA->super_StochasticVariable).super_StochasticProcess.super_Parametric.
                parametricName);
    std::operator+(&local_158,"1/T * integral( O-SPIKE ",&local_178);
    std::operator+(&local_138,&local_158," - ");
    std::__cxx11::string::string
              ((string *)&local_198,
               (string *)
               &(this->spkB->super_StochasticVariable).super_StochasticProcess.super_Parametric.
                parametricName);
    std::operator+(&local_1b8,&local_138,&local_198);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118,
                   &local_1b8,") dt");
    Matrix::setName(__return_storage_ptr__,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    uVar1 = (this->super_Estimator).nSamples;
    dVar2 = this->spkOne;
    Matrix::operator[](&local_118,__return_storage_ptr__,0);
    if (uVar1 == 0) {
      dVar2 = 1.0;
    }
    else {
      dVar2 = dVar2 / (double)uVar1;
    }
    Matrix::operator=(&local_118,dVar2);
    Matrix::~Matrix(&local_118);
  }
  else if (*what == 1) {
    getSample(__return_storage_ptr__,this);
  }
  else {
    Matrix::Matrix(__return_storage_ptr__,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Property not implemented",(allocator<char> *)&local_1b8);
    Matrix::setName(__return_storage_ptr__,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix SpikeEstimator::getEstimate(const Property& what)
{
    if (what==EST_SAMPLE)
        return getSample();
    else if (what==EST_MEAN) {
        Matrix a{1};
        a.setName("1/T * integral( O-SPIKE " + spkA->getName() + " - " + spkB->getName() + ") dt");
        a[0] = getMean();
        return a;
    }
    else {
        Matrix a{0};
        a.setName("Property not implemented");
        return a;
    }
}